

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_QString_&>,_QString_&>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_QString_&>,_QString_&>
                  *this)

{
  int iVar1;
  ProString *pPVar2;
  long lVar3;
  long lVar4;
  QString *pQVar5;
  CutResult CVar6;
  char16_t *__src;
  char16_t *pcVar7;
  long lVar8;
  char16_t *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar2 = (this->a).a.a;
  if (((((pPVar2->m_string).d.ptr == (char16_t *)0x0) &&
       ((((this->a).a.b)->d).ptr == (char16_t *)0x0)) && ((((this->a).b)->d).ptr == (char16_t *)0x0)
      ) && ((this->b->d).ptr == (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001505b6;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = pPVar2->m_length;
    lVar8 = (((this->a).a.b)->d).size;
    lVar3 = (((this->a).b)->d).size;
    lVar4 = (this->b->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,iVar1 + lVar8 + lVar3 + lVar4,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    pPVar2 = (this->a).a.a;
    lVar8 = (long)pPVar2->m_length;
    if (lVar8 != 0) {
      pcVar7 = (pPVar2->m_string).d.ptr;
      local_40 = (long)pPVar2->m_offset;
      local_48 = lVar8;
      CVar6 = QtPrivate::QContainerImplHelper::mid((pPVar2->m_string).d.size,&local_40,&local_48);
      __src = (char16_t *)0x0;
      if (CVar6 != Null) {
        __src = pcVar7 + local_40;
      }
      memcpy(__dest,__src,lVar8 * 2);
      __dest = __dest + lVar8;
    }
    pQVar5 = (this->a).a.b;
    lVar8 = (pQVar5->d).size;
    if (lVar8 != 0) {
      pcVar7 = (pQVar5->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest,pcVar7,lVar8 * 2);
    }
    pQVar5 = (this->a).b;
    lVar3 = (pQVar5->d).size;
    if (lVar3 != 0) {
      pcVar7 = (pQVar5->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest + lVar8,pcVar7,lVar3 * 2);
    }
    lVar4 = (this->b->d).size;
    if (lVar4 != 0) {
      pcVar7 = (this->b->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      memcpy(__dest + lVar8 + lVar3,pcVar7,lVar4 * 2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001505b6:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }